

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int __thiscall QDockAreaLayoutInfo::remove(QDockAreaLayoutInfo *this,char *__filename)

{
  long lVar1;
  qsizetype qVar2;
  reference pQVar3;
  long in_FS_OFFSET;
  int index_1;
  QDockAreaLayoutItem *item;
  int index;
  qsizetype in_stack_ffffffffffffffa8;
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *pos;
  int index_00;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pos = this;
  qVar2 = QList<int>::size((QList<int> *)__filename);
  if (qVar2 < 2) {
    QList<int>::first((QList<int> *)this);
    QList<QDockAreaLayoutItem>::removeAt
              ((QList<QDockAreaLayoutItem> *)this,in_stack_ffffffffffffffa8);
  }
  else {
    QList<int>::first((QList<int> *)this);
    pQVar3 = QList<QDockAreaLayoutItem>::operator[]
                       ((QList<QDockAreaLayoutItem> *)this,in_stack_ffffffffffffffa8);
    this_00 = pQVar3->subinfo;
    QList<int>::mid((QList<int> *)in_stack_ffffffffffffffe0,(qsizetype)pos,(qsizetype)__filename);
    index_00 = (int)((ulong)pos >> 0x20);
    remove(this_00,&stack0xffffffffffffffe0);
    QList<int>::~QList((QList<int> *)0x5707e5);
    unnest(in_stack_ffffffffffffffe0,index_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayoutInfo::remove(const QList<int> &path)
{
    Q_ASSERT(!path.isEmpty());

    if (path.size() > 1) {
        const int index = path.first();
        QDockAreaLayoutItem &item = item_list[index];
        Q_ASSERT(item.subinfo != nullptr);
        item.subinfo->remove(path.mid(1));
        unnest(index);
    } else {
        int index = path.first();
        item_list.removeAt(index);
    }
}